

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O3

boolean encode_mcu_AC_refine(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_encoder *pjVar2;
  JBLOCKROW paJVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  jpeg_entropy_encoder *pjVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  int *piVar13;
  _func_void_j_compress_ptr *p_Var14;
  uint local_54;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    uVar6 = *(uint *)&pjVar2[4].start_pass;
    if (uVar6 == 0) {
      emit_restart(cinfo,*(int *)((long)&pjVar2[4].start_pass + 4));
      uVar6 = cinfo->restart_interval;
      *(uint *)((long)&pjVar2[4].start_pass + 4) =
           *(int *)((long)&pjVar2[4].start_pass + 4) + 1U & 7;
    }
    *(uint *)&pjVar2[4].start_pass = uVar6 - 1;
  }
  paJVar3 = *MCU_data;
  uVar6 = cinfo->Se;
  uVar10 = (ulong)uVar6;
  uVar5 = (long)(int)uVar6;
  local_54 = uVar6;
  if (0 < (long)(int)uVar6) {
    do {
      uVar10 = uVar5;
      uVar9 = (uint)(*paJVar3)[jpeg_natural_order[uVar10]];
      if ((*paJVar3)[jpeg_natural_order[uVar10]] < 0) {
        uVar9 = -uVar9;
      }
      if (uVar9 >> ((byte)cinfo->Al & 0x1f) != 0) {
        local_54 = (uint)uVar10;
        if ((long)uVar10 < 1) goto LAB_0012cb3f;
        lVar12 = (uVar10 & 0xffffffff) + 1;
        goto LAB_0012cb02;
      }
      uVar5 = uVar10 - 1;
    } while (1 < (long)uVar10);
    uVar10 = 0;
    goto LAB_0012cb30;
  }
  goto LAB_0012cb3f;
LAB_0012cbf0:
  if (uVar9 == 1) {
    arith_encode(cinfo,(uchar *)p_Var14,1);
    uVar9 = 0;
  }
  else {
LAB_0012cc38:
    uVar9 = uVar9 & 1;
    pjVar8 = (jpeg_entropy_encoder *)(p_Var14 + 1);
  }
LAB_0012cc44:
  arith_encode(cinfo,(uchar *)pjVar8,uVar9);
  iVar7 = iVar11 + 1;
  if ((int)uVar10 <= iVar11) goto code_r0x0012cc61;
  goto LAB_0012cb6d;
code_r0x0012cc61:
  uVar6 = cinfo->Se;
  iVar7 = iVar11 + 1;
  goto LAB_0012cc6d;
  while( true ) {
    local_54 = local_54 - 1;
    lVar12 = lVar12 + -1;
    if (lVar12 < 2) break;
LAB_0012cb02:
    uVar9 = (uint)(*paJVar3)[*(int *)(&DAT_0017432c + lVar12 * 4)];
    if ((*paJVar3)[*(int *)(&DAT_0017432c + lVar12 * 4)] < 0) {
      uVar9 = -uVar9;
    }
    if (uVar9 >> ((byte)cinfo->Ah & 0x1f) != 0) goto LAB_0012cb3f;
  }
LAB_0012cb30:
  local_54 = 0;
LAB_0012cb3f:
  iVar1 = cinfo->cur_comp_info[0]->ac_tbl_no;
  iVar7 = cinfo->Ss;
  if (iVar7 <= (int)uVar10) {
LAB_0012cb6d:
    p_Var14 = (&pjVar2[9].finish_pass)[iVar1];
    lVar12 = (long)(iVar7 * 3 + -3);
    if ((int)local_54 < iVar7) {
      arith_encode(cinfo,(uchar *)(p_Var14 + lVar12),0);
    }
    piVar13 = jpeg_natural_order + iVar7;
    p_Var14 = p_Var14 + lVar12 + 1;
    iVar11 = iVar7;
    do {
      uVar6 = (uint)(*paJVar3)[*piVar13];
      pjVar8 = pjVar2 + 0xf;
      if ((*paJVar3)[*piVar13] < 0) {
        uVar9 = -uVar6 >> ((byte)cinfo->Al & 0x1f);
        if ((short)uVar9 != 0) {
          if ((uVar9 & 0xffff) != 1) goto LAB_0012cc38;
          arith_encode(cinfo,(uchar *)p_Var14,1);
          uVar9 = 1;
          goto LAB_0012cc44;
        }
      }
      else {
        bVar4 = (byte)cinfo->Al & 0x1f;
        uVar9 = uVar6 >> bVar4;
        if (uVar6 >> bVar4 != 0) goto LAB_0012cbf0;
      }
      arith_encode(cinfo,(uchar *)p_Var14,0);
      iVar11 = iVar11 + 1;
      piVar13 = piVar13 + 1;
      p_Var14 = p_Var14 + 3;
    } while( true );
  }
LAB_0012cc6d:
  if (iVar7 <= (int)uVar6) {
    arith_encode(cinfo,(uchar *)((&pjVar2[9].finish_pass)[iVar1] + (iVar7 * 3 + -3)),1);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_refine(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  register int temp, r, idx;
  char *BR_buffer;
  unsigned int BR;
  int Sl = cinfo->Se - cinfo->Ss + 1;
  int Al = cinfo->Al;
  JCOEF absvalues_unaligned[DCTSIZE2 + 15];
  JCOEF *absvalues;
  const JCOEF *cabsvalue, *EOBPTR;
  size_t zerobits, signbits;
  size_t bits[16 / SIZEOF_SIZE_T];

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart(entropy, entropy->next_restart_num);

#ifdef WITH_SIMD
  cabsvalue = absvalues = (JCOEF *)PAD((JUINTPTR)absvalues_unaligned, 16);
#else
  /* Not using SIMD, so alignment is not needed */
  cabsvalue = absvalues = absvalues_unaligned;
#endif

  /* Prepare data */
  EOBPTR = absvalues +
    entropy->AC_refine_prepare(MCU_data[0][0], jpeg_natural_order + cinfo->Ss,
                               Sl, Al, absvalues, bits);

  /* Encode the AC coefficients per section G.1.2.3, fig. G.7 */

  r = 0;                        /* r = run length of zeros */
  BR = 0;                       /* BR = count of buffered bits added now */
  BR_buffer = entropy->bit_buffer + entropy->BE; /* Append bits to buffer */

  zerobits = bits[0];
#if SIZEOF_SIZE_T == 8
  signbits = bits[1];
#else
  signbits = bits[2];
#endif
  ENCODE_COEFS_AC_REFINE((void)0;);

#if SIZEOF_SIZE_T == 4
  zerobits = bits[1];
  signbits = bits[3];

  if (zerobits) {
    int diff = ((absvalues + DCTSIZE2 / 2) - cabsvalue);
    idx = count_zeroes(&zerobits);
    signbits >>= idx;
    idx += diff;
    r += idx;
    cabsvalue += idx;
    goto first_iter_ac_refine;
  }

  ENCODE_COEFS_AC_REFINE(first_iter_ac_refine:);
#endif

  r |= (int)((absvalues + Sl) - cabsvalue);

  if (r > 0 || BR > 0) {        /* If there are trailing zeroes, */
    entropy->EOBRUN++;          /* count an EOB */
    entropy->BE += BR;          /* concat my correction bits to older ones */
    /* We force out the EOB if we risk either:
     * 1. overflow of the EOB counter;
     * 2. overflow of the correction bit buffer during the next MCU.
     */
    if (entropy->EOBRUN == 0x7FFF ||
        entropy->BE > (MAX_CORR_BITS - DCTSIZE2 + 1))
      emit_eobrun(entropy);
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}